

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pt.cpp
# Opt level: O1

long testStringToInteger(int count)

{
  __time_t _Var1;
  __suseconds_t _Var2;
  long lVar3;
  string value;
  string local_60;
  timeval local_40;
  
  local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_60,"1234","");
  gettimeofday(&local_40,(__timezone_ptr_t)0x0);
  _Var2 = local_40.tv_usec;
  _Var1 = local_40.tv_sec;
  if (0 < count) {
    do {
      FIX::IntConvertor::convert(&local_60);
      count = count + -1;
    } while (count != 0);
  }
  gettimeofday(&local_40,(__timezone_ptr_t)0x0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != &local_60.field_2) {
    operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
  }
  lVar3 = SUB168(SEXT816(_Var2) * SEXT816(-0x20c49ba5e353f7cf),8);
  return (local_40.tv_sec - _Var1) * 1000 +
         ((lVar3 >> 7) - (lVar3 >> 0x3f)) + local_40.tv_usec / 1000;
}

Assistant:

long testStringToInteger( int count )
{
  std::string value( "1234" );
  count = count - 1;

  long start = GetTickCount();
  for ( int i = 0; i <= count; ++i )
  {
    FIX::IntConvertor::convert( value );
  }
  return GetTickCount() - start;
}